

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2dTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2dTest_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_15c76d4::AV1FwdTxfm2dTest::AV1FwdTxfm2dTest((AV1FwdTxfm2dTest *)this_00);
  (((TestWithParam<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_> *)
   &this_00->_vptr_Test)->super_Test)._vptr_Test = (_func_int **)&PTR__TestWithParam_00f3f3f0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__AV1FwdTxfm2dTest_DISABLED_Speed_Test_00f3f430;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }